

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O0

string * toml::internal::unescape(string *codepoint)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  void *this;
  string *in_RSI;
  string *in_RDI;
  stringstream ss;
  uint8_t buf [8];
  uint32_t x;
  allocator local_1b5 [13];
  stringstream local_1a8 [396];
  byte local_1c;
  byte local_1b;
  byte local_1a;
  byte local_19;
  undefined1 local_18;
  uint local_14 [5];
  
  _Var2 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_1a8,in_RSI,_Var2);
  this = (void *)std::istream::operator>>(local_1a8,std::hex);
  std::istream::operator>>(this,local_14);
  bVar1 = (byte)local_14[0];
  if (local_14[0] < 0x80) {
    local_1c = bVar1 & 0x7f;
    local_1b = 0;
  }
  else if (local_14[0] < 0x800) {
    local_1c = (byte)(local_14[0] >> 6) & 0xdf | 0xc0;
    local_1b = bVar1 & 0xbf | 0x80;
    local_1a = 0;
  }
  else if (local_14[0] < 0x10000) {
    local_1c = (byte)(local_14[0] >> 0xc) & 0xef | 0xe0;
    local_1b = (byte)(local_14[0] >> 6) & 0xbf | 0x80;
    local_1a = bVar1 & 0xbf | 0x80;
    local_19 = 0;
  }
  else if (local_14[0] < 0x110000) {
    local_1c = (byte)(local_14[0] >> 0x12) & 0xf7 | 0xf0;
    local_1b = (byte)(local_14[0] >> 0xc) & 0xbf | 0x80;
    local_1a = (byte)(local_14[0] >> 6) & 0xbf | 0x80;
    local_19 = bVar1 & 0xbf | 0x80;
    local_18 = 0;
  }
  else {
    local_1c = 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI,(char *)&local_1c,local_1b5);
  std::allocator<char>::~allocator((allocator<char> *)local_1b5);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return in_RDI;
}

Assistant:

inline std::string unescape(const std::string& codepoint)
{
    std::uint32_t x;
    std::uint8_t buf[8];
    std::stringstream ss(codepoint);

    ss >> std::hex >> x;

    if (x <= 0x7FUL) {
        // 0xxxxxxx
        buf[0] = 0x00 | ((x >> 0) & 0x7F);
        buf[1] = '\0';
    } else if (x <= 0x7FFUL) {
        // 110yyyyx 10xxxxxx
        buf[0] = 0xC0 | ((x >> 6) & 0xDF);
        buf[1] = 0x80 | ((x >> 0) & 0xBF);
        buf[2] = '\0';
    } else if (x <= 0xFFFFUL) {
        // 1110yyyy 10yxxxxx 10xxxxxx
        buf[0] = 0xE0 | ((x >> 12) & 0xEF);
        buf[1] = 0x80 | ((x >> 6) & 0xBF);
        buf[2] = 0x80 | ((x >> 0) & 0xBF);
        buf[3] = '\0';
    } else if (x <= 0x10FFFFUL) {
        // 11110yyy 10yyxxxx 10xxxxxx 10xxxxxx
        buf[0] = 0xF0 | ((x >> 18) & 0xF7);
        buf[1] = 0x80 | ((x >> 12) & 0xBF);
        buf[2] = 0x80 | ((x >> 6) & 0xBF);
        buf[3] = 0x80 | ((x >> 0) & 0xBF);
        buf[4] = '\0';
    } else {
        buf[0] = '\0';
    }

    return reinterpret_cast<char*>(buf);
}